

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-to-double.cc
# Opt level: O1

bool double_conversion::IsHexFloatString<unsigned_short_const*>
               (unsigned_short *start,unsigned_short *end,uc16 separator,bool allow_trailing_junk)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  undefined7 in_register_00000009;
  ushort *puVar5;
  ushort *local_48;
  unsigned_short *local_40;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000009,allow_trailing_junk);
  bVar3 = false;
  local_48 = start;
  local_40 = end;
LAB_0087b367:
  uVar1 = *local_48;
  if (0x3f < uVar1 || 9 < uVar1 - 0x30) {
    uVar4 = uVar1 - 0x2e;
    if (0x38 < uVar4) goto LAB_0087b43c;
    if ((0x1f8000001f80000U >> ((ulong)uVar4 & 0x3f) & 1) == 0) {
      if ((ulong)uVar4 == 0) {
        bVar2 = Advance<unsigned_short_const*>(&local_48,separator,0x10,&local_40);
        if (bVar2) {
          return false;
        }
        while ((uVar1 = *local_48, uVar1 < 0x40 && uVar1 - 0x30 < 10 ||
               ((uVar4 = uVar1 - 0x41, uVar4 < 0x26 &&
                ((0x3f0000003fU >> ((ulong)uVar4 & 0x3f) & 1) != 0))))) {
          bVar2 = Advance<unsigned_short_const*>(&local_48,separator,0x10,&local_40);
          bVar3 = true;
          if (bVar2) {
            return false;
          }
        }
      }
LAB_0087b43c:
      if (((((!bVar3) || ((*local_48 | 0x20) != 0x70)) ||
           (bVar3 = Advance<unsigned_short_const*>(&local_48,separator,0x10,&local_40), bVar3)) ||
          (((*local_48 == 0x2d || (*local_48 == 0x2b)) &&
           (bVar3 = Advance<unsigned_short_const*>(&local_48,separator,0x10,&local_40), bVar3)))) ||
         (9 < *local_48 - 0x30 || 0x39 < *local_48)) {
        return false;
      }
      bVar3 = Advance<unsigned_short_const*>(&local_48,separator,0x10,&local_40);
      if (bVar3) {
        return true;
      }
      while ((puVar5 = local_48, *local_48 < 0x3a && (*local_48 - 0x30 < 10))) {
        bVar3 = Advance<unsigned_short_const*>(&local_48,separator,0x10,&local_40);
        if (bVar3) {
          return true;
        }
      }
      if ((char)local_34 != '\0') {
        return true;
      }
      bVar3 = local_48 != end;
      if ((bVar3) && (bVar2 = isWhitespace((uint)*local_48), bVar2)) {
        do {
          puVar5 = puVar5 + 1;
          bVar3 = puVar5 != end;
          if (puVar5 == end) break;
          bVar2 = isWhitespace((uint)*puVar5);
        } while (bVar2);
      }
      return (bool)(bVar3 ^ 1);
    }
  }
  bVar2 = Advance<unsigned_short_const*>(&local_48,separator,0x10,&local_40);
  bVar3 = true;
  if (bVar2) {
    return false;
  }
  goto LAB_0087b367;
}

Assistant:

static bool IsHexFloatString(Iterator start,
                             Iterator end,
                             uc16 separator,
                             bool allow_trailing_junk) {
  DOUBLE_CONVERSION_ASSERT(start != end);

  Iterator current = start;

  bool saw_digit = false;
  while (isDigit(*current, 16)) {
    saw_digit = true;
    if (Advance(&current, separator, 16, end)) return false;
  }
  if (*current == '.') {
    if (Advance(&current, separator, 16, end)) return false;
    while (isDigit(*current, 16)) {
      saw_digit = true;
      if (Advance(&current, separator, 16, end)) return false;
    }
  }
  if (!saw_digit) return false;
  if (*current != 'p' && *current != 'P') return false;
  if (Advance(&current, separator, 16, end)) return false;
  if (*current == '+' || *current == '-') {
    if (Advance(&current, separator, 16, end)) return false;
  }
  if (!isDigit(*current, 10)) return false;
  if (Advance(&current, separator, 16, end)) return true;
  while (isDigit(*current, 10)) {
    if (Advance(&current, separator, 16, end)) return true;
  }
  return allow_trailing_junk || !AdvanceToNonspace(&current, end);
}